

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::ValidateOptions(google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long lVar1;
  string_view format;
  Arg *in_stack_ffffffffffffff48;
  Arg local_b0;
  Arg local_80;
  ulong local_50;
  long local_48;
  
  local_48 = *(long *)(**(long **)this + 8);
  local_50 = (ulong)*(ushort *)(local_48 + 2);
  local_48 = ~local_50 + local_48;
  substitute_internal::Arg::Arg(&local_80,*(int *)(**(long **)this + 4));
  lVar1 = *(long *)(*(long *)(**(long **)this + 0x20) + 0x10);
  local_b0.piece_._M_len = (size_t)*(ushort *)(lVar1 + 2);
  local_b0.piece_._M_str = (char *)(~local_b0.piece_._M_len + lVar1);
  format._M_str = (char *)&local_50;
  format._M_len =
       (size_t)
       "Missing extension declaration for field $0 with number $1 in extendee message $2. An extension range must declare for all extension fields if its verification state is DECLARATION or there\'s any declaration in the range already. Otherwise, consider splitting up the range."
  ;
  Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)0x110,format,&local_80,&local_b0,
             in_stack_ffffffffffffff48);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}